

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O2

void __thiscall avro::BufferReader::incrementChunk(BufferReader *this,size_type howmuch)

{
  _Elt_pointer pCVar1;
  size_type sVar2;
  
  this->bytesRemaining_ = this->bytesRemaining_ - howmuch;
  sVar2 = howmuch + this->chunkPos_;
  this->chunkPos_ = sVar2;
  pCVar1 = (this->iter_)._M_cur;
  if (sVar2 == (long)pCVar1->writePos_ - (long)pCVar1->readPos_) {
    this->chunkPos_ = 0;
    std::
    _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>::
    operator++(&this->iter_);
    return;
  }
  return;
}

Assistant:

void incrementChunk(size_type howmuch) {
        bytesRemaining_ -= howmuch;
        chunkPos_ += howmuch;
        if(chunkPos_ == iter_->dataSize()) {
            chunkPos_ = 0;
            ++iter_;
        }
    }